

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::HandleFilesMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  cmInstallCommand *this_00;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  PolicyStatus PVar5;
  ostream *poVar6;
  string *psVar7;
  undefined4 extraout_var;
  size_t sVar8;
  cmInstallFilesGenerator *g;
  cmGlobalGenerator *this_01;
  char *pcVar9;
  pointer pbVar10;
  undefined1 auVar11 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  cmCAStringVector files;
  ostringstream e;
  cmInstallCommandArguments ica;
  string local_698;
  undefined4 local_678;
  MessageType local_674;
  int local_670;
  uint local_66c;
  undefined8 local_668;
  cmInstallCommand *local_660;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  cmGlobalGenerator *local_640;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_638;
  cmCAStringVector local_618;
  undefined1 local_5a0 [376];
  cmInstallCommandArguments local_428;
  
  iVar4 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  cmInstallCommandArguments::cmInstallCommandArguments(&local_428,&this->DefaultComponentName);
  pcVar9 = "FILES";
  if (iVar4 == 0) {
    pcVar9 = "PROGRAMS";
  }
  cmCAStringVector::cmCAStringVector
            (&local_618,&local_428.Parser,pcVar9,(cmCommandArgumentGroup *)0x0);
  cmCommandArgument::Follows(&local_618.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(&local_428.ArgumentGroup,&local_618.super_cmCommandArgument);
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_658.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&local_428.Parser,args,&local_658);
  pbVar2 = local_618.Vector.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar10 = local_618.Vector.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_658.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_658.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5a0,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," given unknown argument \"",0x19);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,((local_658.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (local_658.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_698);
LAB_003dc0bd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_698._M_dataplus._M_p != &local_698.field_2) {
      operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
    std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
    bVar3 = false;
    goto LAB_003dc0fb;
  }
  local_670 = iVar4;
  if (local_618.Vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_618.Vector.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = true;
    goto LAB_003dc0fb;
  }
  psVar7 = cmInstallCommandArguments::GetRename_abi_cxx11_(&local_428);
  if ((0x20 < (ulong)((long)pbVar2 - (long)pbVar10)) && (psVar7->_M_string_length != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_5a0,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," given RENAME option with more than one file.",0x2d);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_698);
    goto LAB_003dc0bd;
  }
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_638.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = MakeFilesFullPath(this,(((args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                            &local_618.Vector,&local_638);
  if (bVar3) {
    PVar5 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0062);
    local_668 = CONCAT44(extraout_var,PVar5);
    local_640 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    local_660 = this;
    if (local_618.Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_618.Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_66c = (int)local_668 - 2;
      pbVar10 = local_618.Vector.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar3 = cmGlobalGenerator::IsExportedTargetsFile(local_640,pbVar10);
        if (bVar3) {
          auVar11 = std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
          if (local_66c < 3) {
            local_674 = FATAL_ERROR;
            local_678 = (undefined4)CONCAT71(auVar11._1_7_,1);
            bVar3 = false;
            pcVar9 = "may";
          }
          else {
            if ((int)local_668 == 1) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_698,(cmPolicies *)0x3e,auVar11._8_4_);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_5a0,local_698._M_dataplus._M_p,
                                  local_698._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_698._M_dataplus._M_p != &local_698.field_2) {
                operator_delete(local_698._M_dataplus._M_p,
                                local_698.field_2._M_allocated_capacity + 1);
              }
              bVar3 = false;
              pcVar9 = "should";
            }
            else {
              pcVar9 = (char *)0x0;
              bVar3 = true;
            }
            local_678 = 0;
            local_674 = AUTHOR_WARNING;
          }
          if (!bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5a0,"The file\n  ",0xb);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_5a0,(pbVar10->_M_dataplus)._M_p,
                                pbVar10->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"\nwas generated by the export() command.  It ",0x2c);
            sVar8 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,sVar8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,
                       " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                       ,0x86);
            pcVar1 = (local_660->super_cmCommand).Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar1,local_674,&local_698,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_698._M_dataplus._M_p != &local_698.field_2) {
              operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1
                             );
            }
            if ((char)local_678 != '\0') goto LAB_003dc52d;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
          std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
        }
        pbVar10 = pbVar10 + 1;
      } while (pbVar10 !=
               local_618.Vector.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    bVar3 = cmInstallCommandArguments::Finalize(&local_428);
    this_00 = local_660;
    if (!bVar3) goto LAB_003dc54e;
    psVar7 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&local_428);
    if (psVar7->_M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5a0);
      pbVar10 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_5a0,(pbVar10->_M_dataplus)._M_p,pbVar10->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," given no DESTINATION!",0x16);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this_00->super_cmCommand,&local_698);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_698._M_dataplus._M_p != &local_698.field_2) {
        operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
      }
LAB_003dc52d:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5a0);
      std::ios_base::~ios_base((ios_base *)(local_5a0 + 0x70));
      goto LAB_003dc54e;
    }
    pcVar1 = (this_00->super_cmCommand).Makefile;
    g = CreateInstallFilesGenerator(pcVar1,&local_638,&local_428,local_670 == 0);
    cmMakefile::AddInstallGenerator(pcVar1,&g->super_cmInstallGenerator);
    this_01 = cmMakefile::GetGlobalGenerator((this_00->super_cmCommand).Makefile);
    psVar7 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&local_428);
    bVar3 = true;
    cmGlobalGenerator::AddInstallComponent(this_01,(psVar7->_M_dataplus)._M_p);
  }
  else {
LAB_003dc54e:
    bVar3 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_638);
LAB_003dc0fb:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658);
  local_618.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAStringVector_006d5df0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_618.Vector);
  local_618.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_006d5dc0;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&local_618.super_cmCommandArgument.ArgumentsBefore._M_t);
  cmInstallCommandArguments::~cmInstallCommandArguments(&local_428);
  return bVar3;
}

Assistant:

bool cmInstallCommand::HandleFilesMode(std::vector<std::string> const& args)
{
  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAStringVector files(&ica.Parser, programs ? "PROGRAMS" : "FILES");
  files.Follows(0);
  ica.ArgumentGroup.Follows(&files);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if(!unknownArgs.empty())
    {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
    }

  const std::vector<std::string>& filesVector = files.GetVector();

  // Check if there is something to do.
  if(filesVector.empty())
    {
    return true;
    }

  if(!ica.GetRename().empty() && filesVector.size() > 1)
    {
    // The rename option works only with one file.
    std::ostringstream e;
    e << args[0] << " given RENAME option with more than one file.";
    this->SetError(e.str());
    return false;
    }

  std::vector<std::string> absFiles;
  if (!this->MakeFilesFullPath(args[0].c_str(), filesVector, absFiles))
    {
    return false;
    }

  cmPolicies::PolicyStatus status =
      this->Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  for(std::vector<std::string>::const_iterator fileIt = filesVector.begin();
      fileIt != filesVector.end(); ++fileIt)
    {
    if (gg->IsExportedTargetsFile(*fileIt))
      {
      const char *modal = 0;
      std::ostringstream e;
      cmake::MessageType messageType = cmake::AUTHOR_WARNING;

      switch(status)
        {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = cmake::FATAL_ERROR;
        }
      if (modal)
        {
        e << "The file\n  " << *fileIt << "\nwas generated by the export() "
          "command.  It " << modal << " not be installed with the "
          "install() command.  Use the install(EXPORT) mechanism "
          "instead.  See the cmake-packages(7) manual for more.\n";
        this->Makefile->IssueMessage(messageType, e.str());
        if (messageType == cmake::FATAL_ERROR)
          {
          return false;
          }
        }
      }
    }

  if (!ica.Finalize())
    {
    return false;
    }

  if(ica.GetDestination().empty())
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  // Create the files install generator.
  this->Makefile->AddInstallGenerator(
    CreateInstallFilesGenerator(this->Makefile, absFiles, ica, programs));

  //Tell the global generator about any installation component names specified.
  this->Makefile->GetGlobalGenerator()
                             ->AddInstallComponent(ica.GetComponent().c_str());

  return true;
}